

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_number_to_string.c
# Opt level: O3

size_t cesl_ulong_to_str(unsigned_long value,char *dst_str,uint8_t base)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  char cVar6;
  bool bVar7;
  char acStack_48 [72];
  
  uVar5 = CONCAT71(in_register_00000011,base) & 0xffffffff;
  sVar3 = 0;
  do {
    sVar2 = sVar3;
    cVar4 = (char)(value % uVar5);
    cVar6 = 'W';
    if (cVar4 < '\n') {
      cVar6 = '0';
    }
    acStack_48[sVar2] = cVar6 + cVar4;
    sVar3 = sVar2 + 1;
    bVar7 = uVar5 <= value;
    value = value / uVar5;
  } while (bVar7);
  if (0 < (long)sVar3) {
    for (pcVar1 = acStack_48 + sVar2 + 1; acStack_48 < pcVar1; pcVar1 = pcVar1 + -1) {
      *dst_str = pcVar1[-1];
      dst_str = dst_str + 1;
    }
    *dst_str = '\0';
    return sVar3;
  }
  __assert_fail("(len > 0)&&(\"cesl_uint64_to_str negative lenght\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_strings/cesl_number_to_string.c"
                ,0x91,"size_t cesl_uint64_to_str(uint64_t, char *, uint8_t)");
}

Assistant:

size_t cesl_ulong_to_str(unsigned long value, char* dst_str, uint8_t base)
{
#if (ULONG_MAX == UINT64_MAX)
    return cesl_uint64_to_str(value, dst_str, base);
#elif (ULONG_MAX == UINT32_MAX)
    return cesl_uint32_to_str(value, dst_str, base);
#else
#error cesl_uint_to_string__not_supported_on_this_platfform
#endif
}